

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>::
     Operation<duckdb::string_t,int,duckdb::ArgMinMaxState<duckdb::string_t,int>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (ArgMinMaxState<duckdb::string_t,_int> *state,string_t *x,int *y,
               AggregateBinaryInput *binary)

{
  int iVar1;
  string_t new_value;
  string_t new_value_00;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized == false) {
    new_value_00.value.pointer.ptr = (char *)binary;
    new_value_00.value._0_8_ = (x->value).pointer.ptr;
    ArgMinMaxStateBase::AssignValue<duckdb::string_t>
              ((ArgMinMaxStateBase *)&state->arg,*(string_t **)&x->value,new_value_00);
    state->value = *y;
    (state->super_ArgMinMaxStateBase).is_initialized = true;
  }
  else {
    iVar1 = *y;
    if (state->value < iVar1) {
      new_value.value.pointer.ptr = (char *)binary;
      new_value.value._0_8_ = (x->value).pointer.ptr;
      ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                ((ArgMinMaxStateBase *)&state->arg,*(string_t **)&x->value,new_value);
      state->value = iVar1;
    }
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}